

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha1_End(SHA1_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_44;
  sha2_byte **ppsStack_40;
  int i;
  sha2_byte *d;
  sha2_byte digest [20];
  char *local_18;
  char *buffer_local;
  SHA1_CTX *context_local;
  
  ppsStack_40 = &d;
  local_18 = buffer;
  if (buffer == (char *)0x0) {
    memzero(context,0x60);
  }
  else {
    sha1_Final(context,(sha2_byte *)&d);
    for (local_44 = 0; local_44 < 0x14; local_44 = local_44 + 1) {
      pcVar1 = local_18 + 1;
      *local_18 = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf0) >> 4];
      local_18 = local_18 + 2;
      *pcVar1 = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf)];
      ppsStack_40 = (sha2_byte **)((long)ppsStack_40 + 1);
    }
    *local_18 = '\0';
  }
  memzero(&d,0x14);
  return local_18;
}

Assistant:

char *sha1_End(trezor::SHA1_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA1_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha1_Final(context, digest);

		for (i = 0; i < SHA1_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA1_CTX));
	}
	memzero(digest, SHA1_DIGEST_LENGTH);
	return buffer;
}